

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O1

string * tinyusdz::value::print_array_snipped<tinyusdz::value::matrix4d>
                   (string *__return_storage_ptr__,matrix4d *vals,size_t n,size_t N)

{
  ulong uVar1;
  matrix4d *pmVar2;
  size_t i;
  ulong uVar3;
  size_t sVar4;
  stringstream os;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (N == 0 || n <= N * 2) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
    if (n != 0) {
      sVar4 = 0;
      do {
        if (sVar4 != 0) {
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        }
        ::std::operator<<(local_1a8,vals);
        sVar4 = sVar4 + 1;
        vals = vals + 1;
      } while (n != sVar4);
    }
  }
  else {
    uVar1 = n - N;
    if (n < N) {
      N = n;
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
    uVar3 = 0;
    pmVar2 = vals;
    do {
      if (uVar3 != 0) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
      }
      ::std::operator<<(local_1a8,pmVar2);
      uVar3 = uVar3 + 1;
      pmVar2 = pmVar2 + 1;
    } while (N != uVar3);
    if (N < uVar1) {
      N = uVar1;
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ..., ",7);
    if (N < n) {
      pmVar2 = vals + N;
      uVar1 = N;
      do {
        if (N < uVar1) {
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        }
        ::std::operator<<(local_1a8,pmVar2);
        uVar1 = uVar1 + 1;
        pmVar2 = pmVar2 + 1;
      } while (n != uVar1);
    }
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_array_snipped(const T *vals, size_t n, size_t N = 16) {
  std::stringstream os;

  if ((N == 0) || ((N * 2) >= n)) {
    os << "[";
    for (size_t i = 0; i < n; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }
    os << "]";
  } else {
    size_t head_end = (std::min)(N, n);
    size_t tail_start = (std::max)(n - N, head_end);

    os << "[";

    for (size_t i = 0; i < head_end; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }

    os << ", ..., ";

    for (size_t i = tail_start; i < n; i++) {
      if (i > tail_start) {
        os << ", ";
      }
      os << vals[i];
    }

    os << "]";
  }
  return os.str();
}